

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

Token lex(ptrlen *text,ptrlen *token,char **err)

{
  byte *pbVar1;
  byte c;
  _Bool _Var2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  Token TVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  ptrlen pl2;
  ptrlen pl1;
  
  pbVar10 = (byte *)text->ptr;
  uVar6 = text->len;
  pbVar1 = pbVar10 + uVar6;
  TVar7 = TOK_END;
  for (pbVar11 = pbVar10; pbVar8 = pbVar11, pbVar11 < pbVar1; pbVar11 = pbVar11 + 1) {
    c = *pbVar11;
    uVar4 = (ulong)c;
    if (0x29 < uVar4) {
LAB_00160663:
      if (c == 0x7c) {
LAB_0016066c:
        lVar5 = 0;
        goto LAB_00160684;
      }
      _Var2 = is_atom_char(c);
      if (_Var2) {
        TVar7 = TOK_ATOM;
        pbVar9 = pbVar11;
        goto LAB_00160721;
      }
      pcVar3 = dupstr("unexpected character in expression");
      *err = pcVar3;
      TVar7 = TOK_ERROR;
      pbVar8 = pbVar11 + 1;
      break;
    }
    if ((0x100003e00U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x34200000000U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_00160663;
      goto LAB_0016066c;
    }
    pbVar10 = pbVar10 + 1;
    uVar6 = uVar6 - 1;
  }
  goto LAB_001606df;
LAB_00160684:
  if (lVar5 == 0x78) goto LAB_001606b0;
  uVar4 = *(ulong *)((long)&lex::operators[0].text.len + lVar5);
  if ((uVar4 <= uVar6) &&
     (pl2.len = uVar4, pl2.ptr = pbVar11, pl1.len = uVar4,
     pl1.ptr = *(void **)((long)&lex::operators[0].text.ptr + lVar5),
     _Var2 = ptrlen_eq_ptrlen(pl1,pl2), _Var2)) {
    pbVar8 = pbVar11 + uVar4;
    TVar7 = *(Token *)((long)&lex::operators[0].type + lVar5);
    goto LAB_001606df;
  }
  lVar5 = lVar5 + 0x18;
  goto LAB_00160684;
LAB_001606b0:
  pbVar8 = pbVar11 + 1;
  pcVar3 = dupstr("unrecognised boolean operator");
  *err = pcVar3;
  TVar7 = TOK_ERROR;
  goto LAB_001606df;
  while (_Var2 = is_atom_char(*pbVar9), pbVar8 = pbVar9, _Var2) {
LAB_00160721:
    pbVar9 = pbVar9 + 1;
    pbVar8 = pbVar1;
    if (pbVar1 <= pbVar9) break;
  }
LAB_001606df:
  token->ptr = pbVar11;
  token->len = (long)pbVar8 - (long)pbVar10;
  text->ptr = pbVar8;
  text->len = (long)pbVar1 - (long)pbVar8;
  return TVar7;
}

Assistant:

static Token lex(ptrlen *text, ptrlen *token, char **err)
{
    const char *p = text->ptr, *e = p + text->len;
    Token type = TOK_ERROR;

    /* Skip whitespace */
    while (p < e && is_space(*p))
        p++;

    const char *start = p;

    if (!(p < e)) {
        type = TOK_END;
        goto out;
    }

    if (is_operator_char(*p)) {
        /* Match boolean-expression tokens */
        static const struct operator {
            ptrlen text;
            Token type;
        } operators[] = {
            {PTRLEN_DECL_LITERAL("("), TOK_LPAR},
            {PTRLEN_DECL_LITERAL(")"), TOK_RPAR},
            {PTRLEN_DECL_LITERAL("&&"), TOK_AND},
            {PTRLEN_DECL_LITERAL("||"), TOK_OR},
            {PTRLEN_DECL_LITERAL("!"), TOK_NOT},
        };

        for (size_t i = 0; i < lenof(operators); i++) {
            const struct operator *op = &operators[i];
            if (e - p >= op->text.len &&
                ptrlen_eq_ptrlen(op->text, make_ptrlen(p, op->text.len))) {
                p += op->text.len;
                type = op->type;
                goto out;
            }
        }

        /*
         * Report an error if one of the operator characters is used
         * in a way that doesn't match something in that table (e.g. a
         * single &).
         */
        p++;
        type = TOK_ERROR;
        *err = dupstr("unrecognised boolean operator");
        goto out;
    } else if (is_atom_char(*p)) {
        /*
         * Match an 'atom' token, which is any non-empty sequence of
         * characters from the combined set that allows hostname
         * wildcards, IP address ranges and special predicates like
         * port numbers.
         */
        do {
            p++;
        } while (p < e && is_atom_char(*p));

        type = TOK_ATOM;
        goto out;
    } else {
        /*
         * Otherwise, report an error.
         */
        p++;
        type = TOK_ERROR;
        *err = dupstr("unexpected character in expression");
        goto out;
    }

  out:
    *token = make_ptrlen(start, p - start);
    text->ptr = p;
    text->len = e - p;
    return type;
}